

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operands.c
# Opt level: O3

int operands_extract_modrm
              (_CodeInfo *ci,_PrefixState *ps,_DInst *di,_DecodeType effAdrSz,uint mod,uint rm,
              _iflags instFlags,_Operand *op)

{
  uint8_t uVar1;
  uint uVar2;
  int iVar3;
  bool bVar4;
  short *psVar5;
  int *piVar6;
  uint uVar7;
  _DecodeType dt;
  uint8_t uVar8;
  _iflags defaultSeg;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  uint8_t *puVar12;
  
  uVar2 = ps->usedPrefixes;
  uVar7 = uVar2 | 0x4000;
  ps->usedPrefixes = uVar7;
  if (((instFlags & 0x10) != 0) && ((ps->decodedPrefixes & 0x10) != 0)) {
    uVar7 = uVar2 | 0x4010;
    ps->usedPrefixes = uVar7;
    *(byte *)&di->flags = (byte)di->flags | 1;
  }
  if (effAdrSz == Decode16Bits) {
    if (rm == 6 && mod == 0) {
      op->type = '\x05';
LAB_0010600a:
      di->dispSize = '\x10';
      iVar3 = ci->codeLen;
      ci->codeLen = iVar3 + -2;
      if (iVar3 < 2) {
        return 0;
      }
      psVar5 = (short *)ci->code;
      di->disp = (long)*psVar5;
      psVar5 = psVar5 + 1;
LAB_00106030:
      ci->code = (uint8_t *)psVar5;
    }
    else {
      if (rm < 4) {
        bVar9 = "##%%&\'%#"[rm];
        di->base = bVar9;
        di->usedRegistersMask = di->usedRegistersMask | _REGISTERTORCLASS[bVar9];
        puVar12 = "&\'&\'";
        uVar8 = '\a';
      }
      else {
        puVar12 = "##%%&\'%#";
        uVar8 = '\x06';
      }
      uVar1 = puVar12[rm];
      op->type = uVar8;
      op->index = uVar1;
      if (mod == 2) goto LAB_0010600a;
      if (mod == 1) {
        di->dispSize = '\b';
        iVar3 = ci->codeLen;
        ci->codeLen = iVar3 + -1;
        if (iVar3 < 1) {
          return 0;
        }
        puVar12 = ci->code;
        di->disp = (long)(char)*puVar12;
        psVar5 = (short *)(puVar12 + 1);
        goto LAB_00106030;
      }
    }
    dt = ci->dt;
    if (((rm & 0xfffffffe) == 2) || (mod != 0 && rm == 6)) {
LAB_001061a7:
      defaultSeg = 0x100;
      goto LAB_001061ac;
    }
  }
  else if (rm == 5 && mod == 0) {
    di->dispSize = ' ';
    iVar3 = ci->codeLen;
    ci->codeLen = iVar3 + -4;
    if (iVar3 < 4) {
      return 0;
    }
    piVar6 = (int *)ci->code;
    di->disp = (long)*piVar6;
    ci->code = (uint8_t *)(piVar6 + 1);
    op->type = '\x05';
    dt = ci->dt;
    if (dt == Decode64Bits) {
      op->type = '\x06';
      op->index = 'J';
      *(byte *)&di->flags = (byte)di->flags | 0x80;
    }
  }
  else {
    if (rm == 4) {
      iVar3 = ci->codeLen;
      ci->codeLen = iVar3 + -1;
      if (iVar3 < 1) {
        return 0;
      }
      bVar9 = *ci->code;
      ci->code = ci->code + 1;
      uVar2 = ps->vrex;
      bVar10 = bVar9 >> 3 & 7;
      if ((uVar2 & 2) == 0) {
        if (bVar10 != 4) goto LAB_00106073;
        op->type = '\x06';
        puVar12 = &op->index;
        bVar10 = 4;
        bVar4 = true;
      }
      else {
        uVar7 = uVar7 | 0x2000000;
        ps->usedPrefixes = uVar7;
        bVar10 = bVar10 | 8;
LAB_00106073:
        op->type = '\a';
        puVar12 = &di->base;
        bVar4 = false;
      }
      if ((bVar9 & 7) != 5) {
        if ((uVar2 & 1) != 0) {
          ps->usedPrefixes = uVar7 | 0x2000000;
        }
        *puVar12 = bVar9 & 7 | (effAdrSz != Decode64Bits) * '\x10' + (char)(uVar2 & 1) * '\b';
LAB_001060d2:
        if (di->base != 0xff) {
          di->usedRegistersMask = di->usedRegistersMask | _REGISTERTORCLASS[di->base];
        }
        if (!bVar4) {
LAB_001060ef:
          bVar11 = bVar10 + 0x10;
          if (effAdrSz == Decode64Bits) {
            bVar11 = bVar10;
          }
          uVar8 = '\x01' << (bVar9 >> 6);
          op->index = bVar11;
          if (bVar9 < 0x40) {
            uVar8 = '\0';
          }
          di->scale = uVar8;
        }
        goto LAB_00106121;
      }
      if (mod != 0) {
        if ((uVar2 & 1) != 0) {
          ps->usedPrefixes = uVar7 | 0x2000000;
        }
        *puVar12 = (effAdrSz != Decode64Bits) << 4 | (char)(uVar2 & 1) << 3 | 5;
        goto LAB_001060d2;
      }
      if (!bVar4) goto LAB_001060ef;
      op->type = '\x05';
LAB_00106159:
      di->dispSize = ' ';
      iVar3 = ci->codeLen;
      ci->codeLen = iVar3 + -4;
      if (iVar3 < 4) {
        return 0;
      }
      piVar6 = (int *)ci->code;
      di->disp = (long)*piVar6;
      piVar6 = piVar6 + 1;
LAB_0010617e:
      ci->code = (uint8_t *)piVar6;
    }
    else {
      op->type = '\x06';
      if ((ps->vrex & 1) != 0) {
        ps->usedPrefixes = uVar7 | 0x2000000;
        rm = rm + 8;
      }
      uVar8 = (uint8_t)rm;
      if (effAdrSz != Decode64Bits) {
        uVar8 = uVar8 + '\x10';
      }
      op->index = uVar8;
      bVar9 = 0;
LAB_00106121:
      if (mod == 2) goto LAB_00106159;
      if (mod == 1) {
        di->dispSize = '\b';
        iVar3 = ci->codeLen;
        ci->codeLen = iVar3 + -1;
        if (iVar3 < 1) {
          return 0;
        }
        puVar12 = ci->code;
        di->disp = (long)(char)*puVar12;
        piVar6 = (int *)(puVar12 + 1);
        goto LAB_0010617e;
      }
      if ((bVar9 & 7) == 5) goto LAB_00106159;
    }
    bVar9 = di->base;
    if ((bVar9 == 0xff) && (bVar9 = op->index, 1 < di->scale)) {
      bVar9 = 0;
    }
    dt = ci->dt;
    if ((bVar9 & 0xfe) == 0x14) goto LAB_001061a7;
  }
  defaultSeg = 0x200;
LAB_001061ac:
  prefixes_use_segment(defaultSeg,ps,dt,di);
  return 1;
}

Assistant:

static int operands_extract_modrm(_CodeInfo* ci, _PrefixState* ps, _DInst* di,
                                  _DecodeType effAdrSz, unsigned int mod, unsigned int rm,
                                  _iflags instFlags, _Operand* op)
{
	unsigned char sib = 0, base = 0;

	/* Memory indirection decoding ahead:) */

	ps->usedPrefixes |= INST_PRE_ADDR_SIZE;
	if ((instFlags & INST_PRE_LOCK) && (ps->decodedPrefixes & INST_PRE_LOCK)) {
		ps->usedPrefixes |= INST_PRE_LOCK;
		di->flags |= FLAG_LOCK;
	}

	if (effAdrSz != Decode16Bits) { /* Decode32Bits or Decode64Bits! */
		/* Remember that from a 32/64 bits ModR/M byte a SIB byte could follow! */
		if ((rm == 5) && (mod == 0)) {
			/* 5 is a special case - only 32 bits displacement, or RIP relative. */
			di->dispSize = 32;
			if (!read_stream_safe_sint32(ci, (int64_t*)&di->disp)) return FALSE;

			/* Absolute address: */
			op->type = O_DISP;

			if (ci->dt == Decode64Bits) {
				/* In 64 bits decoding mode depsite of the address size, a RIP-relative address it is. */
				op->type = O_SMEM;
				op->index = R_RIP;
				di->flags |= FLAG_RIP_RELATIVE;
			}

			prefixes_use_segment(INST_PRE_DS, ps, ci->dt, di);
		}
		else {
			if (rm == 4) {
				/* 4 is a special case - SIB byte + disp8/32 follows! */
				/* Read SIB byte. */
				if (!read_stream_safe_uint8(ci, &sib)) return FALSE;
				operands_extract_sib(di, ps, effAdrSz, sib, mod, op);
			}
			else {
				op->type = O_SMEM;
				if (ps->vrex & PREFIX_EX_B) {
					ps->usedPrefixes |= INST_PRE_REX;
					rm += EX_GPR_BASE;
				}

				if (effAdrSz == Decode64Bits) op->index = (uint8_t)(REGS64_BASE + rm);
				else op->index = (uint8_t)(REGS32_BASE + rm);
			}

			if (mod == 1) {
				di->dispSize = 8;
				if (!read_stream_safe_sint8(ci, (int64_t*)&di->disp)) return FALSE;
			}
			else if ((mod == 2) || ((sib & 7) == 5)) { /* If there is no BASE, read DISP32! */
				di->dispSize = 32;
				if (!read_stream_safe_sint32(ci, (int64_t*)&di->disp)) return FALSE;
			}

			/* Get the base register. */
			base = op->index;
			if (di->base != R_NONE) base = di->base;
			else if (di->scale >= 2) base = 0; /* If it's only an index but got scale, it's still DS. */
			/* Default for EBP/ESP is SS segment. 64 bits mode ignores DS anyway. */
			if ((base == R_EBP) || (base == R_ESP)) prefixes_use_segment(INST_PRE_SS, ps, ci->dt, di);
			else prefixes_use_segment(INST_PRE_DS, ps, ci->dt, di);
		}
	}
	else { /* Decode16Bits */
		/* Decoding according to Table 2-1. (16 bits) */
		if ((mod == 0) && (rm == 6)) {
			/* 6 is a special case - only 16 bits displacement. */
			op->type = O_DISP;
			di->dispSize = 16;
			if (!read_stream_safe_sint16(ci, (int64_t*)&di->disp)) return FALSE;
		}
		else {
			/*
			 * Create the O_MEM for 16 bits indirection that requires 2 registers, E.G: [BS+SI].
			 * or create O_SMEM for a single register indirection, E.G: [BP].
			 */
			static uint8_t MODS[] = { R_BX, R_BX, R_BP, R_BP, R_SI, R_DI, R_BP, R_BX };
			static uint8_t MODS2[] = { R_SI, R_DI, R_SI, R_DI };
			if (rm < 4) {
				op->type = O_MEM;
				di->base = MODS[rm];
				di->usedRegistersMask |= _REGISTERTORCLASS[MODS[rm]];
				op->index = MODS2[rm];
			}
			else {
				op->type = O_SMEM;
				op->index = MODS[rm];
			}

			if (mod == 1) { /* 8 bits displacement + indirection */
				di->dispSize = 8;
				if (!read_stream_safe_sint8(ci, (int64_t*)&di->disp)) return FALSE;
			}
			else if (mod == 2) { /* 16 bits displacement + indirection */
				di->dispSize = 16;
				if (!read_stream_safe_sint16(ci, (int64_t*)&di->disp)) return FALSE;
			}
		}

		if ((rm == 2) || (rm == 3) || ((rm == 6) && (mod != 0))) {
			/* BP's default segment is SS, so ignore it. */
			prefixes_use_segment(INST_PRE_SS, ps, ci->dt, di);
		}
		else {
			/* Ignore default DS segment. */
			prefixes_use_segment(INST_PRE_DS, ps, ci->dt, di);
		}
	}

	return TRUE;
}